

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O2

void * consumer(void *arg)

{
  ulong uVar1;
  
  for (uVar1 = 0; (long)uVar1 < (long)nitems; uVar1 = uVar1 + 1) {
    pthread_mutex_lock((pthread_mutex_t *)&ready);
    while (ready.nready == 0) {
      pthread_cond_wait((pthread_cond_t *)&ready.cond,(pthread_mutex_t *)&ready);
    }
    ready.nready = ready.nready + -1;
    pthread_mutex_unlock((pthread_mutex_t *)&ready);
    if (uVar1 != (uint)buf[uVar1]) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
              ,0x40);
      err_sys("buf[%d] = %d",uVar1 & 0xffffffff,buf[uVar1]);
    }
  }
  puts("consumer finished!");
  return (void *)0x0;
}

Assistant:

void *consumer(void *arg) {
    int i;
    for (i = 0; i < nitems; ++i) {
        pthread_mutex_lock(&ready.mutex);
        while (ready.nready == 0) {
            pthread_cond_wait(&ready.cond, &ready.mutex);
        }
        ready.nready--;
        pthread_mutex_unlock(&ready.mutex);
        ASSERT_ERR_SYS(i == buf[i], "buf[%d] = %d", i, buf[i]);
    }
    printf("consumer finished!\n");
    return NULL;
}